

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O1

JsErrorCode JsHasIndexedPropertiesExternalData(JsValueRef object,bool *value)

{
  code *pcVar1;
  bool bVar2;
  Data DVar3;
  BOOL BVar4;
  JsErrorCode JVar5;
  undefined8 in_RAX;
  undefined4 *puVar6;
  RecyclableObject *this;
  DynamicObject *this_00;
  Type typeId;
  DebugCheckNoException local_38;
  DebugCheckNoException __debugCheckNoException;
  
  if (object == (JsValueRef)0x0) {
    JVar5 = JsErrorInvalidArgument;
  }
  else {
    if (value == (bool *)0x0) {
      return JsErrorNullArgument;
    }
    local_38._5_3_ = SUB83((ulong)in_RAX >> 0x28,0);
    local_38.__exceptionCheck.handledExceptionType = (ExceptionType)in_RAX;
    local_38.hasException = true;
    DVar3 = ExceptionCheck::Save();
    local_38.__exceptionCheck.handledExceptionType = DVar3.handledExceptionType;
    *value = false;
    if (((ulong)object & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)object & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/TaggedInt.inl"
                         ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                         "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_0037e2e4;
      *puVar6 = 0;
    }
    typeId = TypeIds_FirstNumberType;
    if ((((ulong)object & 0xffff000000000000) != 0x1000000000000) &&
       (typeId = TypeIds_Number, (ulong)object >> 0x32 == 0)) {
      this = Js::UnsafeVarTo<Js::RecyclableObject>(object);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_0037e2e4;
        *puVar6 = 0;
      }
      typeId = ((this->type).ptr)->typeId;
      if ((0x57 < (int)typeId) && (BVar4 = Js::RecyclableObject::IsExternal(this), BVar4 == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                           ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                           "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
LAB_0037e2e4:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
    }
    bVar2 = Js::DynamicType::Is(typeId);
    if (bVar2) {
      this_00 = Js::UnsafeVarTo<Js::DynamicObject>(object);
      bVar2 = Js::DynamicObject::HasObjectArray(this_00);
      if (bVar2 && this_00->field_1 != (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0) {
        bVar2 = Js::DynamicObject::IsAnyArray((DynamicObject *)this_00->field_1);
        bVar2 = !bVar2;
      }
      else {
        bVar2 = false;
      }
      *value = bVar2;
    }
    local_38.hasException = false;
    DebugCheckNoException::~DebugCheckNoException(&local_38);
    JVar5 = JsNoError;
  }
  return JVar5;
}

Assistant:

CHAKRA_API JsHasIndexedPropertiesExternalData(_In_ JsValueRef object, _Out_ bool *value)
{
    VALIDATE_JSREF(object);
    PARAM_NOT_NULL(value);

    BEGIN_JSRT_NO_EXCEPTION
    {
        *value = false;

        if (Js::DynamicType::Is(Js::JavascriptOperators::GetTypeId(object)))
        {
            Js::DynamicObject* dynamicObject = Js::UnsafeVarTo<Js::DynamicObject>(object);
            Js::ArrayObject* objectArray = dynamicObject->GetObjectArray();
            *value = (objectArray && !Js::DynamicObject::IsAnyArray(objectArray));
        }
    }